

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O3

bool __thiscall pbrt::BSDF::HasTransmission(BSDF *this)

{
  float fVar1;
  ushort uVar2;
  uint uVar3;
  BxDFFlags BVar4;
  ulong uVar5;
  DiffuseBxDF *this_00;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  
  uVar5 = (this->bxdf).
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits;
  uVar2 = (ushort)(uVar5 >> 0x30);
  if ((uint)(uVar5 >> 0x31) < 3) {
    uVar3 = (uint)uVar2;
    if (uVar3 < 3) {
      this_00 = (DiffuseBxDF *)(uVar5 & 0xffffffffffff);
      if (uVar3 == 2) {
        BVar4 = DiffuseBxDF::Flags(this_00);
      }
      else {
        fVar1 = (this_00->R).values.values[0];
        BVar4 = Unset;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          uVar5 = 0xffffffffffffffff;
          do {
            if (uVar5 == 2) {
              BVar4 = Unset;
              goto LAB_00462da1;
            }
            fVar1 = (this_00->R).values.values[uVar5 + 2];
            uVar5 = uVar5 + 1;
          } while ((fVar1 == 0.0) && (!NAN(fVar1)));
          BVar4 = (uint)(uVar5 < 3) * 5;
        }
      }
    }
    else {
      this_01 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                (uVar5 & 0xffffffffffff);
      if (uVar3 - 2 < 2) {
        BVar4 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                          ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                           this_01);
      }
      else if (uVar3 - 2 == 2) {
        BVar4 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags(this_01);
      }
      else {
        vminss_avx(ZEXT416((uint)(this_01->top).mfDistrib.alpha_y),
                   ZEXT416((uint)(this_01->top).mfDistrib.alpha_x));
        BVar4 = GlossyTransmission|Reflection;
      }
    }
  }
  else if (uVar2 - 5 < 3) {
    BVar4 = SpecularTransmission|Reflection;
    if (uVar2 - 5 == 2) {
      BVar4 = Unset;
    }
  }
  else {
    BVar4 = Unset;
    if ((1 < uVar2 - 7) && (BVar4 = Unset, uVar2 - 7 == 2)) {
      vminss_avx(ZEXT416(((uint *)(uVar5 & 0xffffffffffff))[1]),
                 ZEXT416(*(uint *)(uVar5 & 0xffffffffffff)));
      BVar4 = Unset;
    }
  }
LAB_00462da1:
  return SUB41((BVar4 & Transmission) >> 1,0);
}

Assistant:

PBRT_CPU_GPU
    bool HasTransmission() const { return (bxdf.Flags() & BxDFFlags::Transmission); }